

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_warc.c
# Opt level: O0

int archive_write_set_format_warc(archive *_a)

{
  long lVar1;
  int iVar2;
  byte *pbVar3;
  time_t tVar4;
  int magic_test;
  warc_s_conflict *w;
  archive_write *a;
  archive *_a_local;
  
  iVar2 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_warc");
  if (iVar2 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    lVar1._0_4_ = _a[2].magic;
    lVar1._4_4_ = _a[2].state;
    if (lVar1 != 0) {
      (**(code **)(_a + 2))(_a);
    }
    pbVar3 = (byte *)malloc(0x20);
    if (pbVar3 == (byte *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate warc data");
      _a_local._4_4_ = -0x1e;
    }
    else {
      *pbVar3 = *pbVar3 & 0xfe;
      tVar4 = time((time_t *)0x0);
      *(time_t *)(pbVar3 + 8) = tVar4;
      pbVar3[0x10] = 0;
      pbVar3[0x11] = 0;
      pbVar3[0x12] = 0;
      pbVar3[0x13] = 0;
      *(int *)(pbVar3 + 0x14) = (int)*(undefined8 *)(pbVar3 + 8);
      *(byte **)&_a[1].current_codepage = pbVar3;
      _a[1].sconv = (archive_string_conv *)"WARC/1.0";
      _a[1].read_data_offset = (int64_t)_warc_options;
      _a[1].read_data_remaining = (size_t)_warc_header;
      *(code **)&_a[1].read_data_is_posix_read = _warc_data;
      _a[1].read_data_requested = (size_t)_warc_close;
      *(code **)(_a + 2) = _warc_free;
      _a[1].read_data_output_offset = (int64_t)_warc_finish_entry;
      _a->archive_format = 0xf0000;
      _a->archive_format_name = "WARC/1.0";
      _a_local._4_4_ = 0;
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_set_format_warc(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct warc_s *w;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_warc");

	/* If another format was already registered, unregister it. */
	if (a->format_free != NULL) {
		(a->format_free)(a);
	}

	w = malloc(sizeof(*w));
	if (w == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate warc data");
		return (ARCHIVE_FATAL);
	}
	/* by default we're emitting a file wide header */
	w->omit_warcinfo = 0U;
	/* obtain current time for date fields */
	w->now = time(NULL);
	/* reset file type info */
	w->typ = 0;
	/* also initialise our rng */
	w->rng = (unsigned int)w->now;

	a->format_data = w;
	a->format_name = "WARC/1.0";
	a->format_options = _warc_options;
	a->format_write_header = _warc_header;
	a->format_write_data = _warc_data;
	a->format_close = _warc_close;
	a->format_free = _warc_free;
	a->format_finish_entry = _warc_finish_entry;
	a->archive.archive_format = ARCHIVE_FORMAT_WARC;
	a->archive.archive_format_name = "WARC/1.0";
	return (ARCHIVE_OK);
}